

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

Dtt_Man_t * Dtt_ManAlloc(int nVars,int fMulti)

{
  int iVar1;
  Dtt_Man_t *pDVar2;
  int *piVar3;
  word *pwVar4;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *pVVar6;
  uint *puVar7;
  char *pcVar8;
  uint local_28;
  uint local_24;
  Dtt_Man_t *p;
  int fMulti_local;
  int nVars_local;
  
  pDVar2 = (Dtt_Man_t *)calloc(1,0x138);
  pDVar2->nVars = nVars;
  iVar1 = Extra_Factorial(nVars);
  pDVar2->nPerms = iVar1;
  pDVar2->nComps = 1 << ((byte)nVars & 0x1f);
  piVar3 = Extra_PermSchedule(nVars);
  pDVar2->pPerms = piVar3;
  piVar3 = Extra_GreyCodeSchedule(nVars);
  pDVar2->pComps = piVar3;
  pwVar4 = (word *)calloc((long)(1 << ((char)pDVar2->nComps - 7U & 0x1f)),8);
  pDVar2->pPres = pwVar4;
  pVVar5 = Vec_IntAlloc(0x12d450);
  pDVar2->vFanins = pVVar5;
  pVVar5 = Vec_IntAlloc(0x96a28);
  pDVar2->vTruths = pVVar5;
  pVVar5 = Vec_IntAlloc(0x96a28);
  pDVar2->vConfigs = pVVar5;
  pVVar5 = Vec_IntAlloc(0x96a28);
  pDVar2->vClasses = pVVar5;
  pVVar5 = Vec_IntAlloc(0x96a28);
  pDVar2->vTruthNpns = pVVar5;
  pVVar6 = Vec_WecStart(0x10);
  pDVar2->vFunNodes = pVVar6;
  pVVar5 = Vec_IntAlloc(4000);
  pDVar2->vTemp = pVVar5;
  pVVar5 = Vec_IntAlloc(4000);
  pDVar2->vTemp2 = pVVar5;
  if (nVars == 5) {
    local_24 = 0xffffffff;
  }
  else {
    local_24 = 0xff;
    if (nVars == 4) {
      local_24 = 0xffff;
    }
  }
  pDVar2->FunMask = local_24;
  if (nVars == 5) {
    local_28 = 0x80000000;
  }
  else {
    local_28 = 0x80;
    if (nVars == 4) {
      local_28 = 0x8000;
    }
  }
  pDVar2->CmpMask = local_28;
  pDVar2->BinMask = 0x3fff;
  puVar7 = (uint *)malloc((ulong)(pDVar2->BinMask + 1) << 2);
  memset(puVar7,0xff,(ulong)(pDVar2->BinMask + 1) << 2);
  pDVar2->pBins = puVar7;
  pVVar5 = Vec_IntAlloc(4000);
  pDVar2->vUsedBins = pVVar5;
  if (fMulti != 0) {
    puVar7 = Dtt_ManLoadClasses(pDVar2->nVars,&pDVar2->nClasses);
    pDVar2->pTable = puVar7;
    piVar3 = (int *)calloc((long)pDVar2->nClasses,4);
    pDVar2->pNodes = piVar3;
    piVar3 = (int *)calloc((long)pDVar2->nClasses,4);
    pDVar2->pTimes = piVar3;
    pcVar8 = (char *)calloc((long)pDVar2->nClasses,1);
    pDVar2->pVisited = pcVar8;
    pVVar5 = Vec_IntAlloc(1000);
    pDVar2->vVisited = pVVar5;
  }
  return pDVar2;
}

Assistant:

Dtt_Man_t * Dtt_ManAlloc( int nVars, int fMulti )
{
    Dtt_Man_t * p = ABC_CALLOC( Dtt_Man_t, 1 );
    p->nVars      = nVars;
    p->nPerms     = Extra_Factorial( nVars );
    p->nComps     = 1 << nVars;
    p->pPerms     = Extra_PermSchedule( nVars );
    p->pComps     = Extra_GreyCodeSchedule( nVars );
    p->pPres      = ABC_CALLOC( word, 1 << (p->nComps - 7) );
    p->vFanins    = Vec_IntAlloc( 2*617000 );
    p->vTruths    = Vec_IntAlloc( 617000 );
    p->vConfigs   = Vec_IntAlloc( 617000 );
    p->vClasses   = Vec_IntAlloc( 617000 );
    p->vTruthNpns = Vec_IntAlloc( 617000 );
    p->vFunNodes  = Vec_WecStart( 16 );
    p->vTemp      = Vec_IntAlloc( 4000 );
    p->vTemp2     = Vec_IntAlloc( 4000 );
    p->FunMask    = nVars == 5 ?      ~0 : (nVars == 4 ?  0xFFFF :   0xFF);
    p->CmpMask    = nVars == 5 ? 1 << 31 : (nVars == 4 ? 1 << 15 : 1 << 7);
    p->BinMask    = 0x3FFF;
    p->pBins      = ABC_FALLOC( unsigned, p->BinMask + 1 );
    p->vUsedBins  = Vec_IntAlloc( 4000 );
    if ( !fMulti ) return p;
    p->pTable     = Dtt_ManLoadClasses( p->nVars, &p->nClasses );
    p->pNodes     = ABC_CALLOC( int, p->nClasses );
    p->pTimes     = ABC_CALLOC( int, p->nClasses );
    p->pVisited   = ABC_CALLOC( char, p->nClasses );
    p->vVisited   = Vec_IntAlloc( 1000 );
    return p;
}